

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_system_memory.c
# Opt level: O2

SUNMemoryHelper SUNMemoryHelper_Sys(SUNContext sunctx)

{
  SUNMemoryHelper_Ops pSVar1;
  SUNMemoryHelper pSVar2;
  void *pvVar3;
  
  pSVar2 = (SUNMemoryHelper)SUNMemoryHelper_NewEmpty();
  pSVar1 = pSVar2->ops;
  pSVar1->alloc = SUNMemoryHelper_Alloc_Sys;
  pSVar1->allocstrided = SUNMemoryHelper_AllocStrided_Sys;
  pSVar1->dealloc = SUNMemoryHelper_Dealloc_Sys;
  pSVar1->copy = SUNMemoryHelper_Copy_Sys;
  pSVar1->getallocstats = SUNMemoryHelper_GetAllocStats_Sys;
  pSVar1->clone = SUNMemoryHelper_Clone_Sys;
  pSVar1->destroy = SUNMemoryHelper_Destroy_Sys;
  pvVar3 = calloc(1,0x20);
  pSVar2->content = pvVar3;
  return pSVar2;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_Sys(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNMemoryHelper helper;

  /* Allocate the helper */
  helper = SUNMemoryHelper_NewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Set the ops */
  helper->ops->alloc         = SUNMemoryHelper_Alloc_Sys;
  helper->ops->allocstrided  = SUNMemoryHelper_AllocStrided_Sys;
  helper->ops->dealloc       = SUNMemoryHelper_Dealloc_Sys;
  helper->ops->copy          = SUNMemoryHelper_Copy_Sys;
  helper->ops->getallocstats = SUNMemoryHelper_GetAllocStats_Sys;
  helper->ops->clone         = SUNMemoryHelper_Clone_Sys;
  helper->ops->destroy       = SUNMemoryHelper_Destroy_Sys;

  /* Attach content and ops */
  helper->content =
    (SUNMemoryHelper_Content_Sys*)malloc(sizeof(SUNMemoryHelper_Content_Sys));
  SUNAssertNull(helper->content, SUN_ERR_MALLOC_FAIL);

  SUNHELPER_CONTENT(helper)->num_allocations      = 0;
  SUNHELPER_CONTENT(helper)->num_deallocations    = 0;
  SUNHELPER_CONTENT(helper)->bytes_allocated      = 0;
  SUNHELPER_CONTENT(helper)->bytes_high_watermark = 0;

  return helper;
}